

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundImage.cpp
# Opt level: O3

float __thiscall BackgroundImage::x1(BackgroundImage *this)

{
  float fVar1;
  
  if (*this->side != TOP) {
    this = (BackgroundImage *)&this->bottomImage;
  }
  fVar1 = Image::x1(&this->topImage);
  return fVar1;
}

Assistant:

const Image &BackgroundImage::selectedImage() const {
	switch (*side) {
		case Side::TOP:
			return topImage;
		case Side::BOTTOM:
		default:
			return bottomImage;
	}
}